

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

int db_setmetatable(lua_State *L)

{
  int iVar1;
  
  iVar1 = lua_type(L,2);
  if ((iVar1 != 0) && (iVar1 != 5)) {
    luaL_argerror(L,2,"nil or table expected");
  }
  lua_settop(L,2);
  lua_setmetatable(L,1);
  return 1;
}

Assistant:

static int db_setmetatable(lua_State *L) {
    int t = lua_type(L, 2);
    luaL_argcheck(L, t == LUA_TNIL || t == LUA_TTABLE, 2,
                  "nil or table expected");
    lua_settop(L, 2);
    lua_setmetatable(L, 1);
    return 1;  /* return 1st argument */
}